

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcShapeModel::~IfcShapeModel(IfcShapeModel *this)

{
  ~IfcShapeModel(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

IfcShapeModel() : Object("IfcShapeModel") {}